

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::visitBlockStart
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Block *curr,Type inputType)

{
  ScopeCtx local_d8;
  Block *local_28;
  Block *curr_local;
  IRBuilder *this_local;
  Type inputType_local;
  
  local_28 = curr;
  curr_local = (Block *)this;
  this_local = (IRBuilder *)inputType.id;
  inputType_local.id = (uintptr_t)__return_storage_ptr__;
  applyDebugLoc(this,(Expression *)curr);
  ScopeCtx::makeBlock(&local_d8,local_28,(Type)this_local);
  pushScope(__return_storage_ptr__,this,&local_d8);
  ScopeCtx::~ScopeCtx(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::visitBlockStart(Block* curr, Type inputType) {
  applyDebugLoc(curr);
  return pushScope(ScopeCtx::makeBlock(curr, inputType));
}